

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_ToInt32Clamp(JSContext *ctx,int *pres,JSValue val,int min,int max,int min_offset)

{
  JSValue val_00;
  JSValue v;
  int iVar1;
  int64_t in_RCX;
  JSValueUnion in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int res;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  v.tag = in_RCX;
  v.u.float64 = in_RDX.float64;
  JS_DupValue(in_RDI,v);
  val_00.tag = (int64_t)in_RDI;
  val_00.u.ptr = in_RSI.ptr;
  iVar1 = JS_ToInt32SatFree((JSContext *)CONCAT44(in_R8D,in_R9D),
                            (int *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            val_00);
  if (iVar1 == 0) {
    if (*in_RSI.ptr < in_R8D) {
      *(int *)in_RSI.ptr = in_stack_00000008 + *in_RSI.ptr;
      if (*in_RSI.ptr < in_R8D) {
        *(int *)in_RSI.ptr = in_R8D;
      }
    }
    else if (in_R9D < *in_RSI.ptr) {
      *(int *)in_RSI.ptr = in_R9D;
    }
  }
  return iVar1;
}

Assistant:

int JS_ToInt32Clamp(JSContext *ctx, int *pres, JSValueConst val,
                    int min, int max, int min_offset)
{
    int res = JS_ToInt32SatFree(ctx, pres, JS_DupValue(ctx, val));
    if (res == 0) {
        if (*pres < min) {
            *pres += min_offset;
            if (*pres < min)
                *pres = min;
        } else {
            if (*pres > max)
                *pres = max;
        }
    }
    return res;
}